

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

void __thiscall ProblemAloha::ConstructActions(ProblemAloha *this)

{
  MADPComponentDiscreteActions *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  uint uVar3;
  string local_78;
  ProblemAloha *local_58;
  string local_50;
  
  if ((this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
      super_MultiAgentDecisionProcess._m_nrAgents != 0) {
    paVar1 = &local_50.field_2;
    this_00 = &(this->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates._m_A;
    uVar3 = 1;
    local_58 = this;
    do {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"send","");
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Attempt to send a packet","");
      MADPComponentDiscreteActions::AddAction(this_00,uVar3 - 1,&local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"idle","");
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Do nothing, remain idle","");
      MADPComponentDiscreteActions::AddAction(this_00,uVar3 - 1,&local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < (local_58->super_FactoredDecPOMDPDiscrete).
                     super_MultiAgentDecisionProcessDiscreteFactoredStates.
                     super_MultiAgentDecisionProcess._m_nrAgents);
  }
  return;
}

Assistant:

void ProblemAloha::ConstructActions()
{
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
//         _m_nrActions.push_back(2);
//         _m_actionVecs.push_back(vector<ActionDiscrete>() );
        if(SEND==0) // make sure we add them in the correct order
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }
        else
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }

    }
}